

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

ostream * std::operator<<(ostream *ofs,Interpolation v)

{
  Interpolation in_EDX;
  undefined4 in_register_00000034;
  string local_30;
  
  tinyusdz::to_string_abi_cxx11_(&local_30,(tinyusdz *)CONCAT44(in_register_00000034,v),in_EDX);
  std::__ostream_insert<char,std::char_traits<char>>
            (ofs,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Interpolation v) {
  ofs << to_string(v);

  return ofs;
}